

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O0

bool Imf_3_3::anon_unknown_0::readCoreTiledPart
               (exr_context_t f,int part,bool reduceMemory,bool reduceTime)

{
  exr_result_t eVar1;
  long lVar2;
  byte in_CL;
  byte in_DL;
  bool bVar3;
  exr_coding_channel_info_t *outc_1;
  int c_1;
  uint8_t *dptr;
  exr_coding_channel_info_t *outc;
  int c;
  uint64_t bytes;
  int64_t curx;
  int64_t cury;
  int ty;
  int tx;
  exr_decode_pipeline_t decoder;
  exr_chunk_info_t cinfo;
  bool doread;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tiledata;
  int32_t curth;
  int32_t curtw;
  int32_t levh;
  int32_t levw;
  int32_t xlevel;
  int32_t ylevel;
  bool keepgoing;
  int32_t levelsy;
  int32_t levelsx;
  exr_tile_round_mode_t roundingmode;
  exr_tile_level_mode_t levelmode;
  uint32_t tysz;
  uint32_t txsz;
  exr_attr_box2i_t datawin;
  exr_result_t frv;
  exr_result_t rv;
  exr_attr_box2i_t *in_stack_fffffffffffffcc8;
  exr_result_t in_stack_fffffffffffffcd0;
  exr_result_t in_stack_fffffffffffffcd4;
  exr_result_t in_stack_fffffffffffffcd8;
  exr_result_t in_stack_fffffffffffffcdc;
  exr_result_t in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce4;
  undefined1 in_stack_fffffffffffffce5;
  undefined1 in_stack_fffffffffffffce6;
  undefined1 uVar4;
  undefined1 in_stack_fffffffffffffce7;
  undefined1 uVar5;
  exr_const_context_t in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf4;
  exr_const_context_t in_stack_fffffffffffffcf8;
  int local_2f4;
  ulong local_2f0;
  long local_2d8;
  long local_2d0;
  undefined8 local_2c0;
  long local_2b8;
  short local_2b0;
  exr_decode_pipeline_t *in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd6c;
  exr_const_context_t in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffdac;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  exr_const_context_t in_stack_fffffffffffffdc0;
  exr_chunk_info_t *in_stack_fffffffffffffdf0;
  exr_decode_pipeline_t *in_stack_fffffffffffffec0;
  exr_const_context_t in_stack_fffffffffffffec8;
  exr_decode_pipeline_t *in_stack_fffffffffffffed0;
  exr_chunk_info_t *in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee4;
  exr_const_context_t in_stack_fffffffffffffee8;
  exr_attr_box2i_t local_c8;
  char local_b2;
  byte local_81;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  byte local_49;
  int local_48;
  int local_44;
  int local_3c;
  int local_20;
  exr_result_t local_1c;
  byte local_16;
  byte local_15;
  bool local_1;
  
  local_15 = in_DL & 1;
  local_16 = in_CL & 1;
  local_1c = exr_get_data_window((exr_const_context_t)
                                 CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                                 in_stack_fffffffffffffcd4,in_stack_fffffffffffffcc8);
  if (local_1c == 0) {
    local_1c = exr_get_tile_descriptor
                         (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4,
                          (uint32_t *)in_stack_fffffffffffffce8,
                          (uint32_t *)
                          CONCAT17(in_stack_fffffffffffffce7,
                                   CONCAT16(in_stack_fffffffffffffce6,
                                            CONCAT15(in_stack_fffffffffffffce5,
                                                     CONCAT14(in_stack_fffffffffffffce4,
                                                              in_stack_fffffffffffffce0)))),
                          (exr_tile_level_mode_t *)
                          CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                          (exr_tile_round_mode_t *)
                          CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
    if (local_1c == 0) {
      eVar1 = exr_get_tile_levels(in_stack_fffffffffffffce8,
                                  CONCAT13(in_stack_fffffffffffffce7,
                                           CONCAT12(in_stack_fffffffffffffce6,
                                                    CONCAT11(in_stack_fffffffffffffce5,
                                                             in_stack_fffffffffffffce4))),
                                  (int *)CONCAT44(in_stack_fffffffffffffcdc,
                                                  in_stack_fffffffffffffcd8),
                                  (int *)CONCAT44(in_stack_fffffffffffffcd4,
                                                  in_stack_fffffffffffffcd0));
      if (eVar1 == 0) {
        local_49 = 1;
        local_20 = 0;
        local_1c = 0;
        for (local_50 = 0; uVar5 = (local_49 & 1) != 0 && local_50 < local_48, (bool)uVar5;
            local_50 = local_50 + 1) {
          for (local_54 = 0; bVar3 = (local_49 & 1) != 0, uVar4 = bVar3 && local_54 < local_44,
              bVar3 && local_54 < local_44; local_54 = local_54 + 1) {
            local_1c = exr_get_level_sizes(in_stack_fffffffffffffce8,
                                           CONCAT13(uVar5,CONCAT12(uVar4,CONCAT11(
                                                  in_stack_fffffffffffffce5,
                                                  in_stack_fffffffffffffce4))),
                                           in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,
                                           (int32_t *)
                                           CONCAT44(in_stack_fffffffffffffcd4,
                                                    in_stack_fffffffffffffcd0),
                                           (int32_t *)in_stack_fffffffffffffcc8);
            if (local_1c == 0) {
              local_1c = exr_get_tile_sizes(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4,
                                            in_stack_fffffffffffffcf0,
                                            (int)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                                            (int32_t *)
                                            CONCAT17(uVar5,CONCAT16(uVar4,CONCAT15(
                                                  in_stack_fffffffffffffce5,
                                                  CONCAT14(in_stack_fffffffffffffce4,
                                                           in_stack_fffffffffffffce0)))),
                                            (int32_t *)
                                            CONCAT44(in_stack_fffffffffffffcdc,
                                                     in_stack_fffffffffffffcd8));
              if (local_1c == 0) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1677c6);
                local_81 = 0;
                memset(&local_2c0,0,0x1f8);
                local_2c0 = 0x1f8;
                for (local_2d0 = 0; bVar3 = (local_49 & 1) != 0,
                    in_stack_fffffffffffffce5 = bVar3 && local_2d0 < local_5c,
                    bVar3 && local_2d0 < local_5c; local_2d0 = local_64 + local_2d0) {
                  for (local_2d8 = 0; bVar3 = (local_49 & 1) != 0,
                      in_stack_fffffffffffffce4 = bVar3 && local_2d8 < local_58,
                      bVar3 && local_2d8 < local_58; local_2d8 = local_60 + local_2d8) {
                    in_stack_fffffffffffffcc8 = &local_c8;
                    in_stack_fffffffffffffce0 =
                         exr_read_tile_chunk_info
                                   (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,
                                    in_stack_fffffffffffffdb8,
                                    (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                                    (int)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,
                                    in_stack_fffffffffffffdf0);
                    local_1c = in_stack_fffffffffffffce0;
                    if (in_stack_fffffffffffffce0 == 0) {
                      if (local_2b8 == 0) {
                        in_stack_fffffffffffffcdc =
                             exr_decoding_initialize
                                       (in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                                        in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
                        local_1c = in_stack_fffffffffffffcdc;
                        if (in_stack_fffffffffffffcdc != 0) {
                          local_49 = 0;
                          local_20 = in_stack_fffffffffffffcdc;
                          break;
                        }
                        local_2f0 = 0;
                        for (local_2f4 = 0; local_2f4 < local_2b0; local_2f4 = local_2f4 + 1) {
                          lVar2 = local_2b8 + (long)local_2f4 * 0x30;
                          *(ulong *)(lVar2 + 0x28) = local_2f0 + 0x1000;
                          *(int *)(lVar2 + 0x20) = (int)*(short *)(lVar2 + 0x1c);
                          *(int *)(lVar2 + 0x24) = *(int *)(lVar2 + 0x20) * local_60;
                          local_2f0 = (long)local_60 * (long)*(short *)(lVar2 + 0x1c) *
                                      (long)local_64 + local_2f0;
                        }
                        local_81 = 1;
                        if (((local_15 & 1) != 0) && (999999 < local_2f0)) {
                          local_81 = 0;
                        }
                        if (local_b2 == '\x03') {
                          in_stack_fffffffffffffdb0 = &local_80;
                        }
                        else if (local_81 != 0) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                                     (size_type)in_stack_fffffffffffffce8);
                        }
                        in_stack_fffffffffffffcd8 =
                             exr_decoding_choose_default_routines
                                       (in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
                                        in_stack_fffffffffffffd60);
                        local_1c = in_stack_fffffffffffffcd8;
                        if (in_stack_fffffffffffffcd8 != 0) {
                          local_49 = 0;
                          local_20 = in_stack_fffffffffffffcd8;
                          break;
                        }
                      }
                      else {
                        in_stack_fffffffffffffcd4 =
                             exr_decoding_update(in_stack_fffffffffffffce8,
                                                 CONCAT13(uVar5,CONCAT12(uVar4,CONCAT11(
                                                  in_stack_fffffffffffffce5,
                                                  in_stack_fffffffffffffce4))),
                                                 (exr_chunk_info_t *)
                                                 CONCAT44(in_stack_fffffffffffffcdc,
                                                          in_stack_fffffffffffffcd8),
                                                 (exr_decode_pipeline_t *)
                                                 CONCAT44(in_stack_fffffffffffffcd4,
                                                          in_stack_fffffffffffffcd0));
                        local_1c = in_stack_fffffffffffffcd4;
                        if (in_stack_fffffffffffffcd4 != 0) {
                          local_20 = in_stack_fffffffffffffcd4;
                          if ((local_16 & 1) == 0) goto LAB_00167cb2;
                          local_49 = 0;
                          break;
                        }
                      }
                      if ((local_81 & 1) != 0) {
                        if (local_b2 != '\x03') {
                          in_stack_fffffffffffffcf8 =
                               (exr_const_context_t)
                               std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                               operator[](&local_80,0);
                          for (in_stack_fffffffffffffcf4 = 0; in_stack_fffffffffffffcf4 < local_2b0;
                              in_stack_fffffffffffffcf4 = in_stack_fffffffffffffcf4 + 1) {
                            in_stack_fffffffffffffce8 =
                                 (exr_const_context_t)
                                 (local_2b8 + (long)in_stack_fffffffffffffcf4 * 0x30);
                            in_stack_fffffffffffffce8->do_read =
                                 (_func_exr_result_t_exr_const_context_t_void_ptr_uint64_t_uint64_t_ptr_int64_t_ptr__INTERNAL_EXR_READ_MODE
                                  *)in_stack_fffffffffffffcf8;
                            *(int *)&(in_stack_fffffffffffffce8->tmp_filename).str =
                                 (int)(short)(in_stack_fffffffffffffce8->tmp_filename).alloc_size;
                            *(int *)((long)&(in_stack_fffffffffffffce8->tmp_filename).str + 4) =
                                 *(int *)&(in_stack_fffffffffffffce8->tmp_filename).str * local_60;
                            in_stack_fffffffffffffcf8 =
                                 (exr_const_context_t)
                                 (&in_stack_fffffffffffffcf8->mode +
                                 (long)local_60 *
                                 (long)(short)(in_stack_fffffffffffffce8->tmp_filename).alloc_size *
                                 (long)local_64);
                          }
                        }
                        in_stack_fffffffffffffcd0 =
                             exr_decoding_run(in_stack_fffffffffffffce8,
                                              CONCAT13(uVar5,CONCAT12(uVar4,CONCAT11(
                                                  in_stack_fffffffffffffce5,
                                                  in_stack_fffffffffffffce4))),
                                              (exr_decode_pipeline_t *)
                                              CONCAT44(in_stack_fffffffffffffcdc,
                                                       in_stack_fffffffffffffcd8));
                        local_1c = in_stack_fffffffffffffcd0;
                        if ((in_stack_fffffffffffffcd0 != 0) &&
                           (local_20 = in_stack_fffffffffffffcd0, (local_16 & 1) != 0)) {
                          local_49 = 0;
                          break;
                        }
                      }
                    }
                    else {
                      if ((local_3c == 2) || (local_54 == local_50)) {
                        local_20 = in_stack_fffffffffffffce0;
                      }
                      if ((local_16 & 1) != 0) {
                        local_49 = 0;
                        break;
                      }
                    }
LAB_00167cb2:
                  }
                }
                exr_decoding_destroy(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           CONCAT17(uVar5,CONCAT16(uVar4,CONCAT15(in_stack_fffffffffffffce5,
                                                                  CONCAT14(in_stack_fffffffffffffce4
                                                                           ,
                                                  in_stack_fffffffffffffce0)))));
              }
              else {
                if ((local_3c == 2) || (local_54 == local_50)) {
                  local_20 = local_1c;
                }
                if ((local_16 & 1) != 0) {
                  local_49 = 0;
                  break;
                }
              }
            }
            else {
              if ((local_3c == 2) || (local_54 == local_50)) {
                local_20 = local_1c;
              }
              if ((local_16 & 1) != 0) {
                local_49 = 0;
                break;
              }
            }
          }
        }
        local_1 = local_20 != 0;
      }
      else {
        local_1 = true;
      }
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool
readCoreTiledPart (
    exr_context_t f, int part, bool reduceMemory, bool reduceTime)
{
    exr_result_t rv, frv;

    exr_attr_box2i_t datawin;
    rv = exr_get_data_window (f, part, &datawin);
    if (rv != EXR_ERR_SUCCESS) return true;

    uint32_t              txsz, tysz;
    exr_tile_level_mode_t levelmode;
    exr_tile_round_mode_t roundingmode;

    rv = exr_get_tile_descriptor (
        f, part, &txsz, &tysz, &levelmode, &roundingmode);
    if (rv != EXR_ERR_SUCCESS) return true;

    int32_t levelsx, levelsy;
    rv = exr_get_tile_levels (f, part, &levelsx, &levelsy);
    if (rv != EXR_ERR_SUCCESS) return true;

    frv            = rv;
    bool keepgoing = true;
    for (int32_t ylevel = 0; keepgoing && ylevel < levelsy; ++ylevel)
    {
        for (int32_t xlevel = 0; keepgoing && xlevel < levelsx; ++xlevel)
        {
            int32_t levw, levh;
            rv = exr_get_level_sizes (f, part, xlevel, ylevel, &levw, &levh);
            if (rv != EXR_ERR_SUCCESS)
            {
                if (levelmode == EXR_TILE_RIPMAP_LEVELS || xlevel == ylevel)
                    frv = rv;
                if (reduceTime)
                {
                    keepgoing = false;
                    break;
                }
                continue;
            }

            int32_t curtw, curth;
            rv = exr_get_tile_sizes (f, part, xlevel, ylevel, &curtw, &curth);
            if (rv != EXR_ERR_SUCCESS)
            {
                if (levelmode == EXR_TILE_RIPMAP_LEVELS || xlevel == ylevel)
                    frv = rv;
                if (reduceTime)
                {
                    keepgoing = false;
                    break;
                }
                continue;
            }

            // we could make this over all levels but then would have to
            // re-check the allocation size, let's leave it here to check when
            // tile size is < full / top level tile size
            std::vector<uint8_t>  tiledata;
            bool                  doread = false;
            exr_chunk_info_t      cinfo;
            exr_decode_pipeline_t decoder = EXR_DECODE_PIPELINE_INITIALIZER;

            int tx, ty;
            ty = 0;
            for (int64_t cury = 0; keepgoing && cury < levh;
                 cury += curth, ++ty)
            {
                tx = 0;
                for (int64_t curx = 0; keepgoing && curx < levw;
                     curx += curtw, ++tx)
                {
                    rv = exr_read_tile_chunk_info (
                        f, part, tx, ty, xlevel, ylevel, &cinfo);
                    if (rv != EXR_ERR_SUCCESS)
                    {
                        if (levelmode == EXR_TILE_RIPMAP_LEVELS || xlevel == ylevel)
                            frv = rv;
                        if (reduceTime)
                        {
                            keepgoing = false;
                            break;
                        }
                        continue;
                    }

                    if (decoder.channels == NULL)
                    {
                        rv =
                            exr_decoding_initialize (f, part, &cinfo, &decoder);
                        if (rv != EXR_ERR_SUCCESS)
                        {
                            frv       = rv;
                            keepgoing = false;
                            break;
                        }

                        uint64_t bytes = 0;
                        for (int c = 0; c < decoder.channel_count; c++)
                        {
                            exr_coding_channel_info_t& outc =
                                decoder.channels[c];
                            // fake addr for default routines
                            outc.decode_to_ptr = (uint8_t*) 0x1000 + bytes;
                            outc.user_pixel_stride =
                                outc.user_bytes_per_element;
                            outc.user_line_stride =
                                outc.user_pixel_stride * curtw;
                            bytes += (uint64_t) curtw *
                                     (uint64_t) outc.user_bytes_per_element *
                                     (uint64_t) curth;
                        }

                        doread = true;
                        if (reduceMemory && bytes >= gMaxTileBytes)
                            doread = false;

                        if (cinfo.type == EXR_STORAGE_DEEP_TILED)
                        {
                            decoder.decoding_user_data = &tiledata;
                            decoder.realloc_nonimage_data_fn =
                                &realloc_deepdata;
                        }
                        else
                        {
                            if (doread) tiledata.resize (bytes);
                        }
                        rv = exr_decoding_choose_default_routines (
                            f, part, &decoder);
                        if (rv != EXR_ERR_SUCCESS)
                        {
                            frv       = rv;
                            keepgoing = false;
                            break;
                        }
                    }
                    else
                    {
                        rv = exr_decoding_update (f, part, &cinfo, &decoder);
                        if (rv != EXR_ERR_SUCCESS)
                        {
                            frv = rv;
                            if (reduceTime)
                            {
                                keepgoing = false;
                                break;
                            }
                            continue;
                        }
                    }

                    if (doread)
                    {
                        if (cinfo.type != EXR_STORAGE_DEEP_TILED)
                        {
                            uint8_t* dptr = &(tiledata[0]);
                            for (int c = 0; c < decoder.channel_count; c++)
                            {
                                exr_coding_channel_info_t& outc =
                                    decoder.channels[c];
                                outc.decode_to_ptr = dptr;
                                outc.user_pixel_stride =
                                    outc.user_bytes_per_element;
                                outc.user_line_stride =
                                    outc.user_pixel_stride * curtw;
                                dptr += (uint64_t) curtw *
                                        (uint64_t) outc.user_bytes_per_element *
                                        (uint64_t) curth;
                            }
                        }

                        rv = exr_decoding_run (f, part, &decoder);
                        if (rv != EXR_ERR_SUCCESS)
                        {
                            frv = rv;
                            if (reduceTime)
                            {
                                keepgoing = false;
                                break;
                            }
                        }
                    }
                }
            }

            exr_decoding_destroy (f, &decoder);
        }
    }

    return (frv != EXR_ERR_SUCCESS);
}